

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void output_list_to_stdout(uint32_t *list,uint32_t n)

{
  ulong uVar1;
  
  printf("%u\n");
  if (n != 0) {
    uVar1 = 0;
    do {
      printf("%u\n",(ulong)list[uVar1]);
      uVar1 = uVar1 + 1;
    } while (n != uVar1);
  }
  return;
}

Assistant:

void output_list_to_stdout(uint32_t* list, uint32_t n)
{
    printf("%u\n", n);
    for (uint32_t j = 0; j < n; j++) {
        printf("%u\n", list[j]);
    }
}